

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typechecking.cc
# Opt level: O2

void __thiscall
tchecker::details::statement_typechecker_t::visit
          (statement_typechecker_t *this,local_array_statement_t *stmt)

{
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *__x;
  expression_t *expr;
  integer_variables_t *piVar1;
  clock_variables_t *pcVar2;
  element_type *peVar3;
  long lVar4;
  bool bVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  shared_ptr<const_tchecker::typed_var_expression_t> variable;
  statement_type_t stmt_type;
  integer_t size;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  undefined1 local_d4 [12];
  string local_c8;
  long *local_a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_a0;
  string local_98;
  int local_74;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_70;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_50;
  
  this_00 = &local_f8;
  local_d4._0_4_ = 0;
  std::__cxx11::string::string
            ((string *)&local_98,
             (string *)
             &((stmt->_variable).
               super___shared_ptr<const_tchecker::var_expression_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_name);
  expr = (stmt->_size).super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
  piVar1 = this->_intvars;
  pcVar2 = this->_clocks;
  __x = &this->_error;
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&local_50,__x);
  local_d4._4_8_ = &this->_localvars;
  typecheck((tchecker *)&local_f8,expr,(integer_variables_t *)local_d4._4_8_,piVar1,pcVar2,&local_50
           );
  local_a8 = (long *)local_f8._M_dataplus._M_p;
  _Stack_a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._M_string_length;
  local_f8._M_dataplus._M_p = (pointer)0x0;
  local_f8._M_string_length = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_f8._M_string_length);
  std::_Function_base::~_Function_base(&local_50.super__Function_base);
  bVar5 = integer_valued(*(expression_type_t *)(local_a8 + 1));
  if (bVar5) {
    bVar5 = variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::is_variable((variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_d4._4_8_,&local_98);
    if (bVar5) {
      std::operator+(&local_f8,"local variable already exists: ",&local_98);
      std::
      function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::operator()(__x,&local_f8);
      this_00 = &local_f8;
    }
    else {
      bVar5 = variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::is_variable((variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)this->_intvars,&local_98);
      if (!bVar5) {
        local_c8._M_dataplus._M_p._0_4_ =
             const_evaluate((stmt->_size).
                            super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr);
        local_d4._0_4_ = 10;
        local_74 = 1;
        std::make_shared<tchecker::typed_int_expression_t,tchecker::expression_type_t,int&>
                  ((expression_type_t *)&local_f8,&local_74);
        std::__shared_ptr<tchecker::typed_expression_t_const,(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<tchecker::typed_expression_t_const,(__gnu_cxx::_Lock_policy)2> *)
                   &local_a8,
                   (__shared_ptr<tchecker::typed_int_expression_t,_(__gnu_cxx::_Lock_policy)2> *)
                   &local_f8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_f8._M_string_length);
        integer_variables_t::declare
                  ((integer_variables_t *)local_d4._4_8_,&local_98,
                   (intvar_id_t)local_c8._M_dataplus._M_p,-0x80000000,0x7fffffff,0);
        goto LAB_00188400;
      }
      std::operator+(&local_f8,"local variable already exists as a global one: ",&local_98);
      std::
      function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::operator()(__x,&local_f8);
    }
  }
  else {
    expression_t::to_string_abi_cxx11_
              ((string *)(local_d4 + 0xc),
               (expression_t *)((long)local_a8 + *(long *)(*local_a8 + -0x38)));
    std::operator+(&local_f8,"array size is not an integer: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_d4 + 0xc));
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::operator()(__x,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_d4 + 0xc);
  }
  std::__cxx11::string::~string((string *)this_00);
LAB_00188400:
  peVar3 = (stmt->_variable).
           super___shared_ptr<const_tchecker::var_expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  lVar4 = *(long *)(*(long *)peVar3 + -0x38);
  piVar1 = this->_intvars;
  pcVar2 = this->_clocks;
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&local_70,__x);
  typecheck((tchecker *)(local_d4 + 0xc),(expression_t *)((long)&peVar3->field_0x0 + lVar4),
            (integer_variables_t *)local_d4._4_8_,piVar1,pcVar2,&local_70);
  std::dynamic_pointer_cast<tchecker::typed_var_expression_t_const,tchecker::typed_expression_t>
            ((shared_ptr<tchecker::typed_expression_t> *)&local_f8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_c8._M_string_length);
  std::_Function_base::~_Function_base(&local_70.super__Function_base);
  std::
  make_shared<tchecker::typed_local_array_statement_t,tchecker::statement_type_t&,std::shared_ptr<tchecker::typed_var_expression_t_const>&,std::shared_ptr<tchecker::typed_expression_t_const>&>
            ((statement_type_t *)(local_d4 + 0xc),
             (shared_ptr<const_tchecker::typed_var_expression_t> *)local_d4,
             (shared_ptr<const_tchecker::typed_expression_t> *)&local_f8);
  std::__shared_ptr<tchecker::typed_statement_t,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<tchecker::typed_statement_t,(__gnu_cxx::_Lock_policy)2> *)
             &this->_typed_stmt,
             (__shared_ptr<tchecker::typed_local_array_statement_t,_(__gnu_cxx::_Lock_policy)2> *)
             (local_d4 + 0xc));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_c8._M_string_length);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_f8._M_string_length);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_a0);
  std::__cxx11::string::~string((string *)&local_98);
  return;
}

Assistant:

virtual void visit(tchecker::local_array_statement_t const & stmt)
  {
    enum tchecker::statement_type_t stmt_type = tchecker::STMT_TYPE_BAD;

    std::string name = stmt.variable().name();
    std::shared_ptr<tchecker::typed_expression_t const> szexpr{
        tchecker::typecheck(stmt.size(), _localvars, _intvars, _clocks, _error)};

    if (!integer_valued(szexpr->type())) {
      _error("array size is not an integer: " + szexpr->to_string());
    }
    else if (_localvars.is_variable(name)) {
      _error("local variable already exists: " + name);
    }
    else if (_intvars.is_variable(name)) {
      _error("local variable already exists as a global one: " + name);
    }
    else {
      try {
        auto size = tchecker::const_evaluate(stmt.size());
        stmt_type = tchecker::STMT_TYPE_LOCAL_ARRAY;
        szexpr = std::make_shared<tchecker::typed_int_expression_t>(EXPR_TYPE_INTTERM, size);
        _localvars.declare(name, size, tchecker::int_minval, tchecker::int_maxval, 0);
      }
      catch (...) {
        _error("can't compute array size:" + stmt.to_string());
      }
    }
    auto variable = std::dynamic_pointer_cast<tchecker::typed_var_expression_t const>(
        tchecker::typecheck(stmt.variable(), _localvars, _intvars, _clocks, _error));
    _typed_stmt = std::make_shared<tchecker::typed_local_array_statement_t>(stmt_type, variable, szexpr);
  }